

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfl_ssse3.c
# Opt level: O0

void cfl_luma_subsampling_444_hbd_ssse3
               (uint16_t *input,int input_stride,uint16_t *pred_buf_q3,int width,int height)

{
  undefined1 auVar1 [16];
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  undefined8 local_1b8;
  uint16_t *local_190;
  undefined1 (*local_180) [16];
  __m128i row_3;
  __m128i row_2;
  __m128i row_1;
  __m128i row_4;
  __m128i row;
  uint16_t *end;
  int height_local;
  int width_local;
  uint16_t *pred_buf_q3_local;
  int input_stride_local;
  uint16_t *input_local;
  
  local_190 = pred_buf_q3;
  local_180 = (undefined1 (*) [16])input;
  do {
    if (width == 4) {
      auVar1._8_8_ = 0;
      auVar1._0_8_ = *(ulong *)*local_180;
      auVar1 = psllw(auVar1,ZEXT416(3));
      local_1b8 = auVar1._0_8_;
      *(undefined8 *)local_190 = local_1b8;
    }
    else {
      auVar1 = psllw(*local_180,ZEXT416(3));
      local_1c8 = auVar1._0_8_;
      uStack_1c0 = auVar1._8_8_;
      *(undefined8 *)local_190 = local_1c8;
      *(undefined8 *)(local_190 + 4) = uStack_1c0;
      if (0xf < width) {
        auVar1 = psllw(local_180[1],ZEXT416(3));
        local_1d8 = auVar1._0_8_;
        uStack_1d0 = auVar1._8_8_;
        *(undefined8 *)(local_190 + 8) = local_1d8;
        *(undefined8 *)(local_190 + 0xc) = uStack_1d0;
        if (width == 0x20) {
          auVar1 = psllw(local_180[2],ZEXT416(3));
          local_1e8 = auVar1._0_8_;
          uStack_1e0 = auVar1._8_8_;
          *(undefined8 *)(local_190 + 0x10) = local_1e8;
          *(undefined8 *)(local_190 + 0x14) = uStack_1e0;
          auVar1 = psllw(local_180[3],ZEXT416(3));
          local_1f8 = auVar1._0_8_;
          uStack_1f0 = auVar1._8_8_;
          *(undefined8 *)(local_190 + 0x18) = local_1f8;
          *(undefined8 *)(local_190 + 0x1c) = uStack_1f0;
        }
      }
    }
    local_180 = (undefined1 (*) [16])(*local_180 + (long)input_stride * 2);
    local_190 = local_190 + 0x20;
  } while (local_190 < pred_buf_q3 + (height << 5));
  return;
}

Assistant:

static inline void cfl_luma_subsampling_444_hbd_ssse3(const uint16_t *input,
                                                      int input_stride,
                                                      uint16_t *pred_buf_q3,
                                                      int width, int height) {
  const uint16_t *end = pred_buf_q3 + height * CFL_BUF_LINE;
  do {
    if (width == 4) {
      const __m128i row = _mm_slli_epi16(_mm_loadl_epi64((__m128i *)input), 3);
      _mm_storel_epi64((__m128i *)pred_buf_q3, row);
    } else {
      const __m128i row = _mm_slli_epi16(_mm_loadu_si128((__m128i *)input), 3);
      _mm_storeu_si128((__m128i *)pred_buf_q3, row);
      if (width >= 16) {
        __m128i row_1 = _mm_loadu_si128(((__m128i *)input) + 1);
        row_1 = _mm_slli_epi16(row_1, 3);
        _mm_storeu_si128(((__m128i *)pred_buf_q3) + 1, row_1);
        if (width == 32) {
          __m128i row_2 = _mm_loadu_si128(((__m128i *)input) + 2);
          row_2 = _mm_slli_epi16(row_2, 3);
          _mm_storeu_si128(((__m128i *)pred_buf_q3) + 2, row_2);
          __m128i row_3 = _mm_loadu_si128(((__m128i *)input) + 3);
          row_3 = _mm_slli_epi16(row_3, 3);
          _mm_storeu_si128(((__m128i *)pred_buf_q3) + 3, row_3);
        }
      }
    }
    input += input_stride;
    pred_buf_q3 += CFL_BUF_LINE;
  } while (pred_buf_q3 < end);
}